

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O1

void __thiscall Hpipe::InstructionGraph::train(InstructionGraph *this,bool only_cont)

{
  pointer pcVar1;
  pointer pTVar2;
  undefined7 in_register_00000031;
  size_type s;
  string inp;
  Vec<Hpipe::Lexer::TrainingData> tds;
  size_type m;
  size_type local_a0;
  undefined4 local_94;
  string local_90;
  vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> local_70;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  size_type local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000031,only_cont);
  Lexer::training_data((Vec<Hpipe::Lexer::TrainingData> *)&local_70,this->cg->lexer);
  if (local_70.
      super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_70.
      super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:459:22)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:459:22)>
               ::_M_manager;
    Instruction::apply(this->init,(function<void_(Hpipe::Instruction_*)> *)&local_58,true);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_70.
        super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar2 = local_70.
               super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = (pTVar2->inp)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + (pTVar2->inp)._M_string_length);
        local_a0 = 0;
        if ((char)local_94 == '\0') {
          Instruction::train_rec(this->init,&local_a0,&local_38,&local_90,pTVar2->freq,false);
        }
        local_a0 = 0;
        Instruction::train_rec(this->init,&local_a0,&local_38,&local_90,pTVar2->freq,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        pTVar2 = pTVar2 + 1;
      } while (pTVar2 != local_70.
                         super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::~vector
            (&local_70);
  return;
}

Assistant:

void InstructionGraph::train( bool only_cont ) {
    Vec<Lexer::TrainingData> tds = cg->training_data();
    if ( tds.size() ) {
        init->apply( []( Instruction *inst ) {
            for( Transition &t : inst->next )
                t.freq = 0.0;
            inst->freq.assign( 256, 0.0 );
            inst->cum_freq = 0.0;
        }, true );

        for( const Lexer::TrainingData &td : tds ) {
            const std::string inp = td.inp;
            // without contiguous data
            std::string::size_type s = 0, m;
            if ( not only_cont ) {
                init->train_rec( s, m, inp, td.freq, false );
                // with contiguous data
                s = 0;
            }
            init->train_rec( s, m, inp, td.freq, true );
        }
    }
}